

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-storage.c
# Opt level: O1

ndn_hmac_key_t * ndn_key_storage_get_empty_hmac_key(void)

{
  ndn_hmac_key_t *pnVar1;
  long lVar2;
  
  if (!_key_storage_initialized) {
    _ndn_key_storage_init();
  }
  pnVar1 = storage.hmac_keys;
  lVar2 = 10;
  do {
    if (pnVar1->key_id == 0xffffffff) {
      return pnVar1;
    }
    pnVar1 = pnVar1 + 1;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return (ndn_hmac_key_t *)0x0;
}

Assistant:

ndn_hmac_key_t*
ndn_key_storage_get_empty_hmac_key(void)
{
  if (!_key_storage_initialized)
    _ndn_key_storage_init();
  for (uint8_t i = 0; i < NDN_SEC_SIGNING_KEYS_SIZE; i++) {
    if (storage.hmac_keys[i].key_id == NDN_SEC_INVALID_KEY_ID) {
      return &storage.hmac_keys[i];
    }
  }
  return NULL;
}